

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

int AF_A_FirePhoenixPL2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  APhoenixRod *player_00;
  int iVar1;
  int iVar2;
  FState *state;
  AActor *pAVar3;
  bool bVar4;
  bool local_ca;
  bool local_c7;
  FSoundID local_c4;
  undefined1 local_c0 [24];
  undefined1 local_a8 [8];
  DVector3 pos;
  double yo;
  double xo;
  AActor *local_78;
  APhoenixRod *flamethrower;
  player_t *player;
  double dStack_60;
  FSoundID soundid;
  double slope;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x50e,"int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    this = *(AActor **)&param->field_0;
    local_c7 = true;
    if (this != (AActor *)0x0) {
      local_c7 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_c7 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x50e,
                    "int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
        bVar4 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x50e,
                      "int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this_00 = (DObject *)param[1].field_0.field_1.a;
      local_ca = true;
      if (this_00 != (DObject *)0x0) {
        local_ca = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_ca == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x50e,
                      "int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
        bVar4 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x50e,
                      "int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    FSoundID::FSoundID((FSoundID *)((long)&player + 4));
    flamethrower = (APhoenixRod *)this->player;
    if ((player_t *)flamethrower != (player_t *)0x0) {
      FSoundID::operator=((FSoundID *)((long)&player + 4),"weapons/phoenixpowshoot");
      player_00 = flamethrower;
      pAVar3 = *(AActor **)&(flamethrower->super_AWeapon).super_AInventory.super_AActor.sprite;
      local_78 = pAVar3;
      if ((pAVar3 == (AActor *)0x0) ||
         (iVar1 = *(int *)((long)&pAVar3[1].Scale.Y + 4) + -1,
         *(int *)((long)&pAVar3[1].Scale.Y + 4) = iVar1, iVar1 == 0)) {
        FName::FName((FName *)((long)&xo + 4),"Powerdown");
        state = AActor::FindState(pAVar3,(FName *)((long)&xo + 4));
        P_SetPsprite((player_t *)player_00,PSP_WEAPON,state,false);
        *(undefined2 *)&(flamethrower->super_AWeapon).super_AInventory.super_AActor.picnum.texnum =
             0;
        S_StopSound(this,1);
      }
      else {
        dStack_60 = TAngle<double>::TanClamped(&(this->Angles).Pitch,5.0);
        dStack_60 = -dStack_60;
        iVar1 = FRandom::Random2(&pr_fp2);
        iVar2 = FRandom::Random2(&pr_fp2);
        pos.Z = (double)iVar2 / 128.0;
        AActor::Vec3Offset((DVector3 *)local_a8,this,(double)iVar1 / 128.0,pos.Z,
                           (dStack_60 + 26.0) - this->Floorclip,false);
        dStack_60 = dStack_60 + 0.1;
        FName::FName((FName *)(local_c0 + 0x14),"PhoenixFX2");
        pAVar3 = Spawn((FName *)(local_c0 + 0x14),(DVector3 *)local_a8,ALLOW_REPLACE);
        TObjPtr<AActor>::operator=(&pAVar3->target,this);
        TAngle<double>::operator=(&(pAVar3->Angles).Yaw,&(this->Angles).Yaw);
        AActor::VelFromAngle(pAVar3);
        TVector3<double>::XY((TVector3<double> *)local_c0);
        TVector3<double>::operator+=(&pAVar3->Vel,(Vector2 *)local_c0);
        (pAVar3->Vel).Z = pAVar3->Speed * dStack_60;
        if (((short)(flamethrower->super_AWeapon).super_AInventory.super_AActor.picnum.texnum == 0)
           || (bVar4 = S_IsActorPlayingSomething(this,1,-1), !bVar4)) {
          FSoundID::FSoundID(&local_c4,(FSoundID *)((long)&player + 4));
          S_Sound(this,0x101,&local_c4,1.0,1.0);
        }
        P_CheckMissileSpawn(pAVar3,this->radius);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x50e,"int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	double slope;
	FSoundID soundid;
	player_t *player;
	APhoenixRod *flamethrower;

	if (nullptr == (player = self->player))
	{
		return 0;
	}

	soundid = "weapons/phoenixpowshoot";

	flamethrower = static_cast<APhoenixRod *> (player->ReadyWeapon);
	if (flamethrower == nullptr || --flamethrower->FlameCount == 0)
	{ // Out of flame
		P_SetPsprite(player, PSP_WEAPON, flamethrower->FindState("Powerdown"));
		player->refire = 0;
		S_StopSound (self, CHAN_WEAPON);
		return 0;
	}

	slope = -self->Angles.Pitch.TanClamped();
	double xo = pr_fp2.Random2() / 128.;
	double yo = pr_fp2.Random2() / 128.;
	DVector3 pos = self->Vec3Offset(xo, yo, 26 + slope - self->Floorclip);

	slope += 0.1;
	mo = Spawn("PhoenixFX2", pos, ALLOW_REPLACE);
	mo->target = self;
	mo->Angles.Yaw = self->Angles.Yaw;
	mo->VelFromAngle();
	mo->Vel += self->Vel.XY();
	mo->Vel.Z = mo->Speed * slope;
	if (!player->refire || !S_IsActorPlayingSomething (self, CHAN_WEAPON, -1))
	{
		S_Sound (self, CHAN_WEAPON|CHAN_LOOP, soundid, 1, ATTN_NORM);
	}	
	P_CheckMissileSpawn (mo, self->radius);
	return 0;
}